

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEventList.cpp
# Opt level: O2

MidiEventList * __thiscall smf::MidiEventList::operator=(MidiEventList *this,MidiEventList *other)

{
  std::_Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::_Vector_impl_data::
  _M_swap_data((_Vector_impl_data *)this,(_Vector_impl_data *)other);
  return this;
}

Assistant:

MidiEventList& MidiEventList::operator=(MidiEventList& other) {
	list.swap(other.list);
	return *this;
}